

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

void __thiscall google::protobuf::io::Tokenizer::Refresh(Tokenizer *this)

{
  ulong uVar1;
  long in_RDI;
  void *data;
  undefined8 local_10 [2];
  
  if ((*(byte *)(in_RDI + 0x98) & 1) == 0) {
    if ((*(long *)(in_RDI + 0xa8) != 0) && (*(int *)(in_RDI + 0xb0) < *(int *)(in_RDI + 0x90))) {
      std::__cxx11::string::append
                (*(char **)(in_RDI + 0xa8),*(long *)(in_RDI + 0x88) + (long)*(int *)(in_RDI + 0xb0))
      ;
      *(undefined4 *)(in_RDI + 0xb0) = 0;
    }
    local_10[0] = 0;
    *(undefined8 *)(in_RDI + 0x88) = 0;
    *(undefined4 *)(in_RDI + 0x94) = 0;
    do {
      uVar1 = (**(code **)(**(long **)(in_RDI + 0x70) + 0x10))
                        (*(long **)(in_RDI + 0x70),local_10,in_RDI + 0x90);
      if ((uVar1 & 1) == 0) {
        *(undefined4 *)(in_RDI + 0x90) = 0;
        *(undefined1 *)(in_RDI + 0x98) = 1;
        *(undefined1 *)(in_RDI + 0x80) = 0;
        return;
      }
    } while (*(int *)(in_RDI + 0x90) == 0);
    *(undefined8 *)(in_RDI + 0x88) = local_10[0];
    *(undefined1 *)(in_RDI + 0x80) = **(undefined1 **)(in_RDI + 0x88);
  }
  else {
    *(undefined1 *)(in_RDI + 0x80) = 0;
  }
  return;
}

Assistant:

void Tokenizer::Refresh() {
  if (read_error_) {
    current_char_ = '\0';
    return;
  }

  // If we're in a token, append the rest of the buffer to it.
  if (record_target_ != NULL && record_start_ < buffer_size_) {
    record_target_->append(buffer_ + record_start_,
                           buffer_size_ - record_start_);
    record_start_ = 0;
  }

  const void* data = NULL;
  buffer_ = NULL;
  buffer_pos_ = 0;
  do {
    if (!input_->Next(&data, &buffer_size_)) {
      // end of stream (or read error)
      buffer_size_ = 0;
      read_error_ = true;
      current_char_ = '\0';
      return;
    }
  } while (buffer_size_ == 0);

  buffer_ = static_cast<const char*>(data);

  current_char_ = buffer_[0];
}